

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O1

XYZ __thiscall pbrt::SampledSpectrum::ToXYZ(SampledSpectrum *this,SampledWavelengths *lambda)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  int i;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar16 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  XYZ XVar19;
  SampledSpectrum SVar20;
  float local_88 [2];
  int iStack_80;
  int iStack_7c;
  float local_78 [2];
  int iStack_70;
  int iStack_6c;
  float local_68 [2];
  int iStack_60;
  int iStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  auVar16 = in_ZMM1._8_56_;
  auVar12 = in_ZMM0._8_56_;
  SVar20 = DenselySampledSpectrum::Sample(Spectra::x,lambda);
  auVar13._0_8_ = SVar20.values.values._8_8_;
  auVar13._8_56_ = auVar16;
  auVar9._0_8_ = SVar20.values.values._0_8_;
  auVar9._8_56_ = auVar12;
  local_48 = auVar9._0_16_;
  local_58 = auVar13._0_16_;
  SVar20 = DenselySampledSpectrum::Sample(Spectra::y,lambda);
  auVar14._0_8_ = SVar20.values.values._8_8_;
  auVar14._8_56_ = auVar16;
  auVar10._0_8_ = SVar20.values.values._0_8_;
  auVar10._8_56_ = auVar12;
  local_28 = auVar10._0_16_;
  local_38 = auVar14._0_16_;
  SVar20 = DenselySampledSpectrum::Sample(Spectra::z,lambda);
  auVar15._0_8_ = SVar20.values.values._8_8_;
  auVar15._8_56_ = auVar16;
  auVar11._0_8_ = SVar20.values.values._0_8_;
  auVar11._8_56_ = auVar12;
  auVar6 = *(undefined1 (*) [16])(lambda->pdf).values;
  auVar5 = vunpcklpd_avx(local_48,local_58);
  auVar17._0_4_ = auVar5._0_4_ * (this->values).values[0];
  auVar17._4_4_ = auVar5._4_4_ * (this->values).values[1];
  auVar17._8_4_ = auVar5._8_4_ * (this->values).values[2];
  auVar17._12_4_ = auVar5._12_4_ * (this->values).values[3];
  uVar3 = vcmpps_avx512vl(auVar6,ZEXT816(0) << 0x40,4);
  auVar5 = vdivps_avx512vl(auVar17,auVar6);
  fVar1 = (float)((uint)((byte)uVar3 & 1) * auVar5._0_4_);
  local_68[1] = (float)((uint)((byte)(uVar3 >> 1) & 1) * auVar5._4_4_);
  iStack_60 = (uint)((byte)(uVar3 >> 2) & 1) * auVar5._8_4_;
  iStack_5c = (uint)((byte)(uVar3 >> 3) & 1) * auVar5._12_4_;
  lVar4 = 1;
  do {
    fVar1 = fVar1 + local_68[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  auVar5 = vunpcklpd_avx(local_28,local_38);
  auVar18._0_4_ = auVar5._0_4_ * (this->values).values[0];
  auVar18._4_4_ = auVar5._4_4_ * (this->values).values[1];
  auVar18._8_4_ = auVar5._8_4_ * (this->values).values[2];
  auVar18._12_4_ = auVar5._12_4_ * (this->values).values[3];
  uVar3 = vcmpps_avx512vl(auVar6,ZEXT816(0) << 0x40,4);
  auVar5 = vdivps_avx512vl(auVar18,auVar6);
  fVar2 = (float)((uint)((byte)uVar3 & 1) * auVar5._0_4_);
  local_78[1] = (float)((uint)((byte)(uVar3 >> 1) & 1) * auVar5._4_4_);
  iStack_70 = (uint)((byte)(uVar3 >> 2) & 1) * auVar5._8_4_;
  iStack_6c = (uint)((byte)(uVar3 >> 3) & 1) * auVar5._12_4_;
  lVar4 = 1;
  do {
    fVar2 = fVar2 + local_78[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  auVar5 = vmovlhps_avx(auVar11._0_16_,auVar15._0_16_);
  auVar8._0_4_ = auVar5._0_4_ * (this->values).values[0];
  auVar8._4_4_ = auVar5._4_4_ * (this->values).values[1];
  auVar8._8_4_ = auVar5._8_4_ * (this->values).values[2];
  auVar8._12_4_ = auVar5._12_4_ * (this->values).values[3];
  uVar3 = vcmpps_avx512vl(auVar6,ZEXT816(0) << 0x40,4);
  auVar6 = vdivps_avx512vl(auVar8,auVar6);
  fVar7 = (float)((uint)((byte)uVar3 & 1) * auVar6._0_4_);
  local_88[1] = (float)((uint)((byte)(uVar3 >> 1) & 1) * auVar6._4_4_);
  iStack_80 = (uint)((byte)(uVar3 >> 2) & 1) * auVar6._8_4_;
  iStack_7c = (uint)((byte)(uVar3 >> 3) & 1) * auVar6._12_4_;
  lVar4 = 1;
  do {
    fVar7 = fVar7 + local_88[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  auVar6 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar2),0x10);
  auVar5._8_4_ = 0x3e800000;
  auVar5._0_8_ = 0x3e8000003e800000;
  auVar5._12_4_ = 0x3e800000;
  auVar5 = vmulps_avx512vl(auVar6,auVar5);
  auVar6._8_4_ = 0x42d5b6bb;
  auVar6._0_8_ = 0x42d5b6bb42d5b6bb;
  auVar6._12_4_ = 0x42d5b6bb;
  auVar6 = vdivps_avx512vl(auVar5,auVar6);
  XVar19.Z = (fVar7 * 0.25) / 106.856895;
  XVar19._0_8_ = auVar6._0_8_;
  return XVar19;
}

Assistant:

XYZ SampledSpectrum::ToXYZ(const SampledWavelengths &lambda) const {
    SampledSpectrum X = Spectra::X().Sample(lambda);
    SampledSpectrum Y = Spectra::Y().Sample(lambda);
    SampledSpectrum Z = Spectra::Z().Sample(lambda);
    SampledSpectrum pdf = lambda.PDF();

    return XYZ(SafeDiv(X * *this, pdf).Average(), SafeDiv(Y * *this, pdf).Average(),
               SafeDiv(Z * *this, pdf).Average()) /
           CIE_Y_integral;
}